

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

void ecc_weierstrass_curve_free(WeierstrassCurve *wc)

{
  mp_free(wc->p);
  mp_free(wc->a);
  mp_free(wc->b);
  monty_free(wc->mc);
  if (wc->sc != (ModsqrtContext *)0x0) {
    modsqrt_free(wc->sc);
  }
  safefree(wc);
  return;
}

Assistant:

void ecc_weierstrass_curve_free(WeierstrassCurve *wc)
{
    mp_free(wc->p);
    mp_free(wc->a);
    mp_free(wc->b);
    monty_free(wc->mc);
    if (wc->sc)
        modsqrt_free(wc->sc);
    sfree(wc);
}